

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

string * __thiscall
Context::execute(string *__return_storage_ptr__,Context *this,string *input,
                shared_ptr<Session> *session)

{
  Session *this_00;
  string *psVar1;
  bool bVar2;
  char cVar3;
  tm *__tp;
  size_t sVar4;
  ostream *poVar5;
  string actor;
  time_t now;
  char timestamp [32];
  string local_108;
  string local_e8;
  Parser local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Parser::Parser(&local_c8,input);
  Parser::actor_abi_cxx11_(&local_108,&local_c8);
  bVar2 = Grammar::is_type(&local_108);
  if (bVar2) {
    execute_in_type_abi_cxx11_(&local_e8,this,&local_c8);
LAB_0013f3f4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    psVar1 = &local_e8;
  }
  else {
    bVar2 = Grammar::is_context(&local_108);
    if (bVar2) {
      execute_in_context_abi_cxx11_(&local_e8,this,&local_c8);
      goto LAB_0013f3f4;
    }
    bVar2 = Grammar::is_variable(&local_108);
    if (bVar2) {
      execute_in_variable_abi_cxx11_(&local_e8,this,&local_c8);
      goto LAB_0013f3f4;
    }
    bVar2 = Grammar::is_connection(&local_108);
    if (!bVar2) goto LAB_0013f417;
    this_00 = (session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Parser::message_name_abi_cxx11_(&local_50,&local_c8);
    Parser::arguments_abi_cxx11_(&local_68,&local_c8);
    Session::receive(&local_e8,this_00,&local_50,&local_68);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    psVar1 = &local_50;
    local_e8._M_dataplus._M_p = local_50._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &psVar1->field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
LAB_0013f417:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8._arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._message_name._M_dataplus._M_p != &local_c8._message_name.field_2) {
    operator_delete(local_c8._message_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._actor._M_dataplus._M_p != &local_c8._actor.field_2) {
    operator_delete(local_c8._actor._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)time((time_t *)0x0);
  __tp = localtime((time_t *)&local_e8);
  strftime((char *)&local_c8,0x20,"[%F %T]",__tp);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    if (this->_is_quiet_mode != false) {
      return __return_storage_ptr__;
    }
    sVar4 = strlen((char *)&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)&local_c8,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    str_utils::trim(&local_108,input);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_108._M_dataplus._M_p,local_108._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(__return_storage_ptr__->_M_dataplus)._M_p,
                        __return_storage_ptr__->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    sVar4 = strlen((char *)&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_c8,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    str_utils::trim(&local_108,input);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this,local_108._M_dataplus._M_p,local_108._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(__return_storage_ptr__->_M_dataplus)._M_p,
                        __return_storage_ptr__->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Context::execute(const std::string& input, std::shared_ptr<Session> session) {
    std::string output;
    try {
        Parser parser(input);
        std::string actor = parser.actor();
        if (Grammar::is_type(actor))
            output = execute_in_type(parser);
        else if (Grammar::is_context(actor))
            output = execute_in_context(parser);
        else if (Grammar::is_variable(actor))
            output = execute_in_variable(parser);
        else if (Grammar::is_connection(actor))
            output = session->receive(parser.message_name(), parser.arguments());
    }
    catch (const char* exception) {
        output = std::string(exception);
    }
    catch (...) {
        output = std::string(EXC_UNKNOWN_ERROR);
    }
    char timestamp[32];
    time_t now = time(NULL);
    strftime(timestamp, sizeof(timestamp), "[%F %T]", localtime(&now));
    if (_logfile.is_open())
        _logfile << timestamp << " " << str_utils::trim(input) << " -> " << output << std::endl;
    else if (!_is_quiet_mode)
        std::cout << timestamp << " " << str_utils::trim(input) << " -> " << output << std::endl;
    return output;
}